

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

bool __thiscall OIDType::generateInternalData(OIDType *this)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  int local_5c;
  int i;
  int encoded_length;
  uint8_t temp [10];
  long tempVal;
  char *endNum;
  char *startNum;
  char *pcStack_28;
  bool toBreak;
  char *valuePtr;
  OIDType *local_18;
  OIDType *this_local;
  
  local_18 = this;
  lVar2 = std::__cxx11::string::find((char *)&this->_value,0x210988);
  if (lVar2 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->data);
    valuePtr._7_1_ = 0x2b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->data,(value_type_conflict3 *)((long)&valuePtr + 7));
    pcStack_28 = (char *)std::__cxx11::string::operator[]((ulong)&this->_value);
    while (*pcStack_28 != '\0') {
      pcVar3 = strchr(pcStack_28,0x2e);
      memset((void *)((long)&i + 2),0,10);
      iVar1 = __isoc99_sscanf(pcStack_28,"%ld.",temp + 2);
      if (iVar1 == 0) {
        return false;
      }
      sVar4 = encode_ber_longform_integer((uint8_t *)((long)&i + 2),temp._2_8_,10);
      for (local_5c = 0; local_5c < (int)sVar4; local_5c = local_5c + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->data,(value_type_conflict3 *)((long)&i + (long)local_5c + 2));
      }
      if (pcVar3 == (char *)0x0) break;
      pcStack_28 = pcVar3 + 1;
    }
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    (this->super_BER_CONTAINER)._length = (int)sVar5;
    this_local._7_1_ = true;
  }
  else {
    this->valid = false;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OIDType::generateInternalData() {
    if(_value.find(".1.3.") != 0) { this->valid = false; return false; }; // Invalid OID

    this->data.clear();
    this->data.push_back(0x2b); // first byte

    char* valuePtr = &_value[5];

    while(*valuePtr != 0){
        bool toBreak = false;
        char* startNum = valuePtr;

        // Find the end of this item (next dot or end of string)
        char* endNum = strchr(startNum, '.');
        if(!endNum) {
            toBreak = true;
        }

        long tempVal;
        uint8_t temp[10] = {0};
        if(sscanf(startNum, "%ld.", &tempVal)){
            int encoded_length = encode_ber_longform_integer(temp, tempVal, 10);

            for(int i = 0; i < encoded_length; i++){
                this->data.push_back(temp[i]);
            }

            if(toBreak) break;
            valuePtr = endNum+1;
        } else {
            return false;
        }
    }

    this->_length = this->data.size();
    return true;
}